

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::StringReplace
               (string *s,string *oldsub,string *newsub,bool replace_all,string *res)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  size_type pos;
  size_type start_pos;
  string *res_local;
  bool replace_all_local;
  string *newsub_local;
  string *oldsub_local;
  string *s_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pos = 0;
    do {
      lVar2 = std::__cxx11::string::find((string *)s,(ulong)oldsub);
      if (lVar2 == -1) break;
      std::__cxx11::string::append((string *)res,(ulong)s,pos);
      std::__cxx11::string::append((string *)res);
      lVar3 = std::__cxx11::string::size();
      pos = lVar2 + lVar3;
    } while (replace_all);
    std::__cxx11::string::length();
    std::__cxx11::string::append((string *)res,(ulong)s,pos);
  }
  else {
    std::__cxx11::string::append((string *)res);
  }
  return;
}

Assistant:

void StringReplace(const string& s, const string& oldsub,
                   const string& newsub, bool replace_all,
                   string* res) {
  if (oldsub.empty()) {
    res->append(s);  // if empty, append the given string.
    return;
  }

  string::size_type start_pos = 0;
  string::size_type pos;
  do {
    pos = s.find(oldsub, start_pos);
    if (pos == string::npos) {
      break;
    }
    res->append(s, start_pos, pos - start_pos);
    res->append(newsub);
    start_pos = pos + oldsub.size();  // start searching again after the "old"
  } while (replace_all);
  res->append(s, start_pos, s.length() - start_pos);
}